

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O3

int cram_index_build(cram_fd *fd,char *fn_base)

{
  hFILE *phVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  zfp *zf;
  cram_container *c;
  cram_block *b;
  cram_block_compression_hdr *pcVar10;
  cram_slice *s;
  cram_block_slice_hdr *pcVar11;
  ulong uVar12;
  ulong uVar13;
  cram_record *pcVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *local_1860;
  char local_1838 [1024];
  char buf [1024];
  char fn_idx [4096];
  
  sVar9 = strlen(fn_base);
  uVar8 = 0xffffffff;
  if (sVar9 < 0xffb) {
    sprintf(fn_idx,"%s.crai",fn_base);
    zf = zfopen(fn_idx,"wz");
    if (zf == (zfp *)0x0) {
      perror(fn_idx);
    }
    else {
      phVar1 = fd->fp;
      lVar2 = phVar1->offset;
      pcVar3 = phVar1->buffer;
      local_1860 = phVar1->begin;
      c = cram_read_container(fd);
      if (c != (cram_container *)0x0) {
        local_1860 = local_1860 + (lVar2 - (long)pcVar3);
        do {
          if (fd->err != 0) {
            perror("Cram container read");
            return 1;
          }
          phVar1 = fd->fp;
          lVar2 = phVar1->offset;
          pcVar3 = phVar1->begin;
          pcVar4 = phVar1->buffer;
          b = cram_read_block(fd);
          c->comp_hdr_block = b;
          if (b == (cram_block *)0x0) {
            return 1;
          }
          if (b->content_type != COMPRESSION_HEADER) {
            __assert_fail("c->comp_hdr_block->content_type == COMPRESSION_HEADER",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                          ,0x1fd,"int cram_index_build(cram_fd *, const char *)");
          }
          pcVar10 = cram_decode_compression_header(fd,b);
          c->comp_hdr = pcVar10;
          if (pcVar10 == (cram_block_compression_hdr *)0x0) {
            return -1;
          }
          if (0 < c->num_landmarks) {
            lVar19 = 0;
            do {
              phVar1 = fd->fp;
              lVar17 = phVar1->offset;
              pcVar5 = phVar1->begin;
              pcVar6 = phVar1->buffer;
              if ((long)(pcVar5 + (lVar17 - (long)pcVar6)) - (long)(local_1860 + c->offset) !=
                  (long)c->landmark[lVar19]) {
                __assert_fail("spos - cpos - c->offset == c->landmark[j]",
                              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                              ,0x20a,"int cram_index_build(cram_fd *, const char *)");
              }
              s = cram_read_slice(fd);
              if (s == (cram_slice *)0x0) {
                zfclose(zf);
                return -1;
              }
              phVar1 = fd->fp;
              uVar16 = (ulong)(uint)(((int)phVar1->offset + *(int *)&phVar1->begin) -
                                    ((int)(pcVar5 + (lVar17 - (long)pcVar6)) +
                                    *(int *)&phVar1->buffer));
              pcVar11 = s->hdr;
              if (pcVar11->ref_seq_id == 0xfffffffe) {
                uVar8 = c->landmark[lVar19];
                iVar7 = cram_decode_slice(fd,c,s,fd->header);
                if ((iVar7 != 0) || (pcVar11 = s->hdr, pcVar11->num_records < 1)) goto LAB_0012a324;
                pcVar14 = s->crecs;
                uVar13 = 0xfffffffe;
                iVar7 = -0x80000000;
                lVar17 = 0;
                lVar18 = 0;
                iVar15 = 0;
                uVar12 = 0;
                do {
                  if (*(int *)((long)&pcVar14->ref_id + lVar17) == (int)uVar13) {
                    iVar15 = *(int *)((long)&pcVar14->aend + lVar17);
                    if (iVar7 <= iVar15) {
                      iVar7 = iVar15;
                    }
                  }
                  else {
                    if ((int)uVar13 != -2) {
                      sprintf(local_1838,"%d\t%d\t%d\t%ld\t%d\t%d\n",uVar13,uVar12,
                              (ulong)(iVar7 + iVar15 + 1),local_1860,(ulong)uVar8,uVar16);
                      zfputs(local_1838,zf);
                      pcVar11 = s->hdr;
                      pcVar14 = s->crecs;
                    }
                    uVar13 = (ulong)*(uint *)((long)&pcVar14->ref_id + lVar17);
                    uVar12 = (ulong)*(uint *)((long)&pcVar14->apos + lVar17);
                    iVar7 = -0x80000000;
                  }
                  iVar15 = -(int)uVar12;
                  lVar18 = lVar18 + 1;
                  lVar17 = lVar17 + 0x70;
                } while (lVar18 < pcVar11->num_records);
                if ((int)uVar13 != -2) {
                  sprintf(local_1838,"%d\t%d\t%d\t%ld\t%d\t%d\n",uVar13,uVar12,
                          (ulong)((iVar7 - (int)uVar12) + 1),local_1860,(ulong)uVar8,uVar16);
                  zfputs(local_1838,zf);
                }
                cram_free_slice(s);
              }
              else {
                sprintf(buf,"%d\t%d\t%d\t%ld\t%d\t%d\n",(ulong)(uint)pcVar11->ref_seq_id,
                        (ulong)(uint)pcVar11->ref_seq_start,(ulong)(uint)pcVar11->ref_seq_span,
                        local_1860,(ulong)(uint)c->landmark[lVar19],uVar16);
                zfputs(buf,zf);
LAB_0012a324:
                cram_free_slice(s);
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < c->num_landmarks);
          }
          phVar1 = fd->fp;
          local_1860 = phVar1->begin + (phVar1->offset - (long)phVar1->buffer);
          if (local_1860 != pcVar3 + (long)c->length + (lVar2 - (long)pcVar4)) {
            __assert_fail("cpos == hpos + c->length",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                          ,0x222,"int cram_index_build(cram_fd *, const char *)");
          }
          cram_free_container(c);
          c = cram_read_container(fd);
        } while (c != (cram_container *)0x0);
      }
      iVar7 = fd->err;
      uVar8 = zfclose(zf);
      uVar8 = uVar8 | -(uint)(iVar7 != 0);
    }
  }
  return uVar8;
}

Assistant:

int cram_index_build(cram_fd *fd, const char *fn_base) {
    cram_container *c;
    off_t cpos, spos, hpos;
    zfp *fp;
    char fn_idx[PATH_MAX];

    if (strlen(fn_base) > PATH_MAX-6)
	return -1;

    sprintf(fn_idx, "%s.crai", fn_base);
    if (!(fp = zfopen(fn_idx, "wz"))) {
        perror(fn_idx);
        return -1;
    }

    cpos = htell(fd->fp);
    while ((c = cram_read_container(fd))) {
        int j;

        if (fd->err) {
            perror("Cram container read");
            return 1;
        }

        hpos = htell(fd->fp);

        if (!(c->comp_hdr_block = cram_read_block(fd)))
            return 1;
        assert(c->comp_hdr_block->content_type == COMPRESSION_HEADER);

        c->comp_hdr = cram_decode_compression_header(fd, c->comp_hdr_block);
        if (!c->comp_hdr)
            return -1;

        // 2.0 format
        for (j = 0; j < c->num_landmarks; j++) {
            char buf[1024];
            cram_slice *s;
            int sz;

            spos = htell(fd->fp);
            assert(spos - cpos - c->offset == c->landmark[j]);

            if (!(s = cram_read_slice(fd))) {
		zfclose(fp);
		return -1;
	    }

            sz = (int)(htell(fd->fp) - spos);

	    if (s->hdr->ref_seq_id == -2) {
		cram_index_build_multiref(fd, c, s, fp,
					  cpos, c->landmark[j], sz);
	    } else {
		sprintf(buf, "%d\t%d\t%d\t%"PRId64"\t%d\t%d\n",
			s->hdr->ref_seq_id, s->hdr->ref_seq_start,
			s->hdr->ref_seq_span, (int64_t)cpos,
			c->landmark[j], sz);
		zfputs(buf, fp);
	    }

            cram_free_slice(s);
        }

        cpos = htell(fd->fp);
        assert(cpos == hpos + c->length);

        cram_free_container(c);
    }
    if (fd->err) {
	zfclose(fp);
	return -1;
    }
	

    return zfclose(fp);
}